

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_avx2::forward_inplace(LRN_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  uint _c;
  size_t sVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int *piVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  void *pvVar20;
  pointer piVar21;
  bool bVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  float *pfVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  undefined1 (*pauVar35) [32];
  long lVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  uint uVar40;
  void *pvVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [32];
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  allocator_type local_241;
  undefined8 local_240;
  Mat square_sum;
  Mat square_blob;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar40 = bottom_top_blob->w;
  uVar23 = bottom_top_blob->h;
  _c = bottom_top_blob->c;
  uVar42 = (ulong)_c;
  sVar2 = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (Allocator *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)square_blob.data;
  square_blob.dims = (int)square_blob.refcount;
  square_blob.w = square_blob.refcount._4_4_;
  square_blob._48_8_ = square_blob.elemsize;
  square_blob.c = square_blob.elempack;
  Mat::create(&square_blob,uVar40,uVar23,_c,sVar2,opt->workspace_allocator);
  iVar24 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001f763c;
  uVar32 = uVar23 * uVar40;
  if (0 < (int)_c) {
    uVar26 = 0;
    do {
      pfVar30 = (float *)(bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      pauVar35 = (undefined1 (*) [32])
                 (square_blob.cstep * uVar26 * square_blob.elemsize + (long)square_blob.data);
      if ((int)uVar32 < 8) {
        uVar33 = 0;
      }
      else {
        iVar37 = 7;
        do {
          auVar63._4_4_ = pfVar30[1] * pfVar30[1];
          auVar63._0_4_ = *pfVar30 * *pfVar30;
          auVar63._8_4_ = pfVar30[2] * pfVar30[2];
          auVar63._12_4_ = pfVar30[3] * pfVar30[3];
          auVar63._16_4_ = pfVar30[4] * pfVar30[4];
          auVar63._20_4_ = pfVar30[5] * pfVar30[5];
          auVar63._24_4_ = pfVar30[6] * pfVar30[6];
          auVar63._28_4_ = pfVar30[7];
          *pauVar35 = auVar63;
          pfVar30 = pfVar30 + 8;
          pauVar35 = pauVar35 + 1;
          iVar37 = iVar37 + 8;
          uVar33 = uVar32 & 0xfffffff8;
        } while (iVar37 < (int)uVar32);
      }
      if (uVar32 - uVar33 != 0 && (int)uVar33 <= (int)uVar32) {
        lVar39 = 0;
        do {
          *(float *)(*pauVar35 + lVar39 * 4) = pfVar30[lVar39] * pfVar30[lVar39];
          lVar39 = lVar39 + 1;
        } while (uVar32 - uVar33 != (int)lVar39);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar42);
  }
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx2[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,uVar40,uVar23,_c,sVar2,opt->workspace_allocator);
    bVar22 = square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0;
    if (bVar22) {
      piVar15 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (square_sum.allocator == (Allocator *)0x0) {
            if (square_sum.data != (void *)0x0) {
              free(square_sum.data);
            }
          }
          else {
            (*(square_sum.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_001f763c;
    }
    if (0 < square_sum.c * (int)square_sum.cstep) {
      memset(square_sum.data,0,(ulong)(uint)(square_sum.c * (int)square_sum.cstep) << 2);
    }
    if (0 < (int)_c) {
      fVar71 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx2[-3]) /
               (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
      pp_Var3 = this->_vptr_LRN_x86_avx2;
      uVar26 = 0;
      auVar74._8_4_ = 0xffffff82;
      auVar74._0_8_ = 0xffffff82ffffff82;
      auVar74._12_4_ = 0xffffff82;
      auVar74._16_4_ = 0xffffff82;
      auVar74._20_4_ = 0xffffff82;
      auVar74._24_4_ = 0xffffff82;
      auVar74._28_4_ = 0xffffff82;
      local_240 = CONCAT44(local_240._4_4_,uVar32) & 0xfffffffffffffff8;
      uVar40 = uVar32 & 0xfffffff8;
      do {
        auVar73._8_4_ = 0x3d9021bb;
        auVar73._0_8_ = 0x3d9021bb3d9021bb;
        auVar69._8_4_ = 0xbdfe5d4f;
        auVar69._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar61._8_4_ = 0xbdebd1b8;
        auVar61._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar73._12_4_ = 0x3d9021bb;
        auVar69._12_4_ = 0xbdfe5d4f;
        auVar61._12_4_ = 0xbdebd1b8;
        auVar58._12_4_ = 0x3f800000;
        auVar73._16_4_ = 0x3d9021bb;
        auVar69._16_4_ = 0xbdfe5d4f;
        auVar61._16_4_ = 0xbdebd1b8;
        auVar58._16_4_ = 0x3f800000;
        auVar73._20_4_ = 0x3d9021bb;
        auVar69._20_4_ = 0xbdfe5d4f;
        auVar61._20_4_ = 0xbdebd1b8;
        auVar58._20_4_ = 0x3f800000;
        auVar73._24_4_ = 0x3d9021bb;
        auVar69._24_4_ = 0xbdfe5d4f;
        auVar61._24_4_ = 0xbdebd1b8;
        auVar58._24_4_ = 0x3f800000;
        auVar73._28_4_ = 0x3d9021bb;
        auVar69._28_4_ = 0xbdfe5d4f;
        auVar61._28_4_ = 0xbdebd1b8;
        auVar58._28_4_ = 0x3f800000;
        iVar24 = *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]) / 2;
        iVar37 = (int)uVar26;
        uVar23 = iVar37 - iVar24;
        if ((int)uVar23 <= iVar24 + iVar37) {
          do {
            if (uVar23 < _c) {
              pfVar30 = (float *)(uVar23 * square_blob.cstep * square_blob.elemsize +
                                 (long)square_blob.data);
              pauVar35 = (undefined1 (*) [32])
                         (square_sum.cstep * uVar26 *
                          CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize) +
                         (long)square_sum.data);
              uVar33 = 0;
              if (7 < (int)uVar32) {
                iVar24 = 7;
                do {
                  auVar46._0_4_ = *(float *)*pauVar35 + *pfVar30;
                  auVar46._4_4_ = *(float *)(*pauVar35 + 4) + pfVar30[1];
                  auVar46._8_4_ = *(float *)(*pauVar35 + 8) + pfVar30[2];
                  auVar46._12_4_ = *(float *)(*pauVar35 + 0xc) + pfVar30[3];
                  auVar46._16_4_ = *(float *)(*pauVar35 + 0x10) + pfVar30[4];
                  auVar46._20_4_ = *(float *)(*pauVar35 + 0x14) + pfVar30[5];
                  auVar46._24_4_ = *(float *)(*pauVar35 + 0x18) + pfVar30[6];
                  auVar46._28_4_ = *(float *)(*pauVar35 + 0x1c) + pfVar30[7];
                  *pauVar35 = auVar46;
                  pfVar30 = pfVar30 + 8;
                  pauVar35 = pauVar35 + 1;
                  iVar24 = iVar24 + 8;
                  uVar33 = uVar40;
                } while (iVar24 < (int)uVar32);
              }
              if (uVar32 - uVar33 != 0 && (int)uVar33 <= (int)uVar32) {
                lVar39 = 0;
                do {
                  *(float *)(*pauVar35 + lVar39 * 4) =
                       *(float *)(*pauVar35 + lVar39 * 4) + pfVar30[lVar39];
                  lVar39 = lVar39 + 1;
                } while (uVar32 - uVar33 != (int)lVar39);
              }
            }
            bVar6 = (int)uVar23 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]) / 2 + iVar37;
            uVar23 = uVar23 + 1;
          } while (bVar6);
        }
        pauVar35 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        pauVar44 = (undefined1 (*) [32])
                   (square_sum.cstep * uVar26 *
                    CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize) +
                   (long)square_sum.data);
        uVar23 = 0;
        if (7 < (int)uVar32) {
          uVar1 = *(undefined4 *)(&this->field_0xe0 + (long)pp_Var3[-3]);
          fVar45 = -*(float *)(&this->field_0xdc + (long)pp_Var3[-3]);
          iVar24 = 7;
          auVar57._8_4_ = 0x3e4cceac;
          auVar57._0_8_ = 0x3e4cceac3e4cceac;
          auVar57._12_4_ = 0x3e4cceac;
          auVar57._16_4_ = 0x3e4cceac;
          auVar57._20_4_ = 0x3e4cceac;
          auVar57._24_4_ = 0x3e4cceac;
          auVar57._28_4_ = 0x3e4cceac;
          auVar72._8_4_ = 0xbe7ffffc;
          auVar72._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar72._12_4_ = 0xbe7ffffc;
          auVar72._16_4_ = 0xbe7ffffc;
          auVar72._20_4_ = 0xbe7ffffc;
          auVar72._24_4_ = 0xbe7ffffc;
          auVar72._28_4_ = 0xbe7ffffc;
          auVar75._8_4_ = 0x3f317218;
          auVar75._0_8_ = 0x3f3172183f317218;
          auVar75._12_4_ = 0x3f317218;
          auVar75._16_4_ = 0x3f317218;
          auVar75._20_4_ = 0x3f317218;
          auVar75._24_4_ = 0x3f317218;
          auVar75._28_4_ = 0x3f317218;
          auVar76._8_4_ = 0xbf000000;
          auVar76._0_8_ = 0xbf000000bf000000;
          auVar76._12_4_ = 0xbf000000;
          auVar76._16_4_ = 0xbf000000;
          auVar76._20_4_ = 0xbf000000;
          auVar76._24_4_ = 0xbf000000;
          auVar76._28_4_ = 0xbf000000;
          do {
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            auVar16._16_4_ = uVar1;
            auVar16._20_4_ = uVar1;
            auVar16._24_4_ = uVar1;
            auVar16._28_4_ = uVar1;
            auVar19._4_4_ = fVar71;
            auVar19._0_4_ = fVar71;
            auVar19._8_4_ = fVar71;
            auVar19._12_4_ = fVar71;
            auVar19._16_4_ = fVar71;
            auVar19._20_4_ = fVar71;
            auVar19._24_4_ = fVar71;
            auVar19._28_4_ = fVar71;
            auVar14 = vfmadd132ps_fma(*pauVar44,auVar16,auVar19);
            auVar62._8_4_ = 0x800000;
            auVar62._0_8_ = 0x80000000800000;
            auVar62._12_4_ = 0x800000;
            auVar62._16_4_ = 0x800000;
            auVar62._20_4_ = 0x800000;
            auVar62._24_4_ = 0x800000;
            auVar62._28_4_ = 0x800000;
            auVar7 = vmaxps_avx(ZEXT1632(auVar14),auVar62);
            auVar18._8_4_ = 0x807fffff;
            auVar18._0_8_ = 0x807fffff807fffff;
            auVar18._12_4_ = 0x807fffff;
            auVar18._16_4_ = 0x807fffff;
            auVar18._20_4_ = 0x807fffff;
            auVar18._24_4_ = 0x807fffff;
            auVar18._28_4_ = 0x807fffff;
            auVar63 = vandps_avx(auVar7,auVar18);
            auVar17._8_4_ = 0x3f000000;
            auVar17._0_8_ = 0x3f0000003f000000;
            auVar17._12_4_ = 0x3f000000;
            auVar17._16_4_ = 0x3f000000;
            auVar17._20_4_ = 0x3f000000;
            auVar17._24_4_ = 0x3f000000;
            auVar17._28_4_ = 0x3f000000;
            auVar12 = vorps_avx(auVar63,auVar17);
            auVar70._8_4_ = 0x3f3504f3;
            auVar70._0_8_ = 0x3f3504f33f3504f3;
            auVar70._12_4_ = 0x3f3504f3;
            auVar70._16_4_ = 0x3f3504f3;
            auVar70._20_4_ = 0x3f3504f3;
            auVar70._24_4_ = 0x3f3504f3;
            auVar70._28_4_ = 0x3f3504f3;
            auVar46 = vcmpps_avx(auVar12,auVar70,1);
            auVar63 = vandps_avx(auVar46,auVar12);
            auVar66._0_4_ = auVar12._0_4_ + -1.0 + auVar63._0_4_;
            auVar66._4_4_ = auVar12._4_4_ + -1.0 + auVar63._4_4_;
            auVar66._8_4_ = auVar12._8_4_ + -1.0 + auVar63._8_4_;
            auVar66._12_4_ = auVar12._12_4_ + -1.0 + auVar63._12_4_;
            auVar66._16_4_ = auVar12._16_4_ + -1.0 + auVar63._16_4_;
            auVar66._20_4_ = auVar12._20_4_ + -1.0 + auVar63._20_4_;
            auVar66._24_4_ = auVar12._24_4_ + -1.0 + auVar63._24_4_;
            auVar66._28_4_ = auVar12._28_4_ + -1.0 + auVar63._28_4_;
            auVar63 = vpsrld_avx2(auVar7,0x17);
            auVar63 = vpaddd_avx2(auVar63,auVar74);
            auVar7 = vcvtdq2ps_avx(auVar63);
            auVar63 = vandps_avx(auVar58,auVar46);
            auVar46 = vsubps_avx(auVar7,auVar63);
            auVar13 = vfmadd213ps_fma(auVar73,auVar66,auVar61);
            auVar47._8_4_ = 0x3def251a;
            auVar47._0_8_ = 0x3def251a3def251a;
            auVar47._12_4_ = 0x3def251a;
            auVar47._16_4_ = 0x3def251a;
            auVar47._20_4_ = 0x3def251a;
            auVar47._24_4_ = 0x3def251a;
            auVar47._28_4_ = 0x3def251a;
            auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar66,auVar47);
            auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar66,auVar69);
            auVar48._8_4_ = 0x3e11e9bf;
            auVar48._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar48._12_4_ = 0x3e11e9bf;
            auVar48._16_4_ = 0x3e11e9bf;
            auVar48._20_4_ = 0x3e11e9bf;
            auVar48._24_4_ = 0x3e11e9bf;
            auVar48._28_4_ = 0x3e11e9bf;
            auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar66,auVar48);
            auVar49._8_4_ = 0xbe2aae50;
            auVar49._0_8_ = 0xbe2aae50be2aae50;
            auVar49._12_4_ = 0xbe2aae50;
            auVar49._16_4_ = 0xbe2aae50;
            auVar49._20_4_ = 0xbe2aae50;
            auVar49._24_4_ = 0xbe2aae50;
            auVar49._28_4_ = 0xbe2aae50;
            auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar66,auVar49);
            auVar63 = vcmpps_avx(ZEXT1632(auVar14),_DAT_00319580,2);
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar66,auVar57);
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar66,auVar72);
            auVar50._8_4_ = 0x3eaaaaaa;
            auVar50._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar50._12_4_ = 0x3eaaaaaa;
            auVar50._16_4_ = 0x3eaaaaaa;
            auVar50._20_4_ = 0x3eaaaaaa;
            auVar50._24_4_ = 0x3eaaaaaa;
            auVar50._28_4_ = 0x3eaaaaaa;
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar66,auVar50);
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar66,auVar76);
            auVar13 = vfmadd213ps_fma(auVar46,auVar75,auVar66);
            auVar7._4_4_ = auVar66._4_4_ * auVar66._4_4_;
            auVar7._0_4_ = auVar66._0_4_ * auVar66._0_4_;
            auVar7._8_4_ = auVar66._8_4_ * auVar66._8_4_;
            auVar7._12_4_ = auVar66._12_4_ * auVar66._12_4_;
            auVar7._16_4_ = auVar66._16_4_ * auVar66._16_4_;
            auVar7._20_4_ = auVar66._20_4_ * auVar66._20_4_;
            auVar7._24_4_ = auVar66._24_4_ * auVar66._24_4_;
            auVar7._28_4_ = auVar66._28_4_;
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar7,ZEXT1632(auVar14));
            auVar63 = vorps_avx(auVar63,ZEXT1632(auVar14));
            auVar12._4_4_ = auVar63._4_4_ * fVar45;
            auVar12._0_4_ = auVar63._0_4_ * fVar45;
            auVar12._8_4_ = auVar63._8_4_ * fVar45;
            auVar12._12_4_ = auVar63._12_4_ * fVar45;
            auVar12._16_4_ = auVar63._16_4_ * fVar45;
            auVar12._20_4_ = auVar63._20_4_ * fVar45;
            auVar12._24_4_ = auVar63._24_4_ * fVar45;
            auVar12._28_4_ = auVar63._28_4_;
            auVar51._8_4_ = 0x42b0c0a5;
            auVar51._0_8_ = 0x42b0c0a542b0c0a5;
            auVar51._12_4_ = 0x42b0c0a5;
            auVar51._16_4_ = 0x42b0c0a5;
            auVar51._20_4_ = 0x42b0c0a5;
            auVar51._24_4_ = 0x42b0c0a5;
            auVar51._28_4_ = 0x42b0c0a5;
            auVar63 = vminps_avx(auVar12,auVar51);
            auVar52._8_4_ = 0xc2b0c0a5;
            auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar52._12_4_ = 0xc2b0c0a5;
            auVar52._16_4_ = 0xc2b0c0a5;
            auVar52._20_4_ = 0xc2b0c0a5;
            auVar52._24_4_ = 0xc2b0c0a5;
            auVar52._28_4_ = 0xc2b0c0a5;
            auVar46 = vmaxps_avx(auVar63,auVar52);
            auVar64._8_4_ = 0x3fb8aa3b;
            auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar64._12_4_ = 0x3fb8aa3b;
            auVar64._16_4_ = 0x3fb8aa3b;
            auVar64._20_4_ = 0x3fb8aa3b;
            auVar64._24_4_ = 0x3fb8aa3b;
            auVar64._28_4_ = 0x3fb8aa3b;
            auVar14 = vfmsub213ps_fma(auVar64,auVar46,auVar76);
            auVar7 = vroundps_avx(ZEXT1632(auVar14),1);
            auVar63 = vcmpps_avx(ZEXT1632(auVar14),auVar7,1);
            auVar63 = vandps_avx(auVar58,auVar63);
            auVar63 = vsubps_avx(auVar7,auVar63);
            auVar13 = vfnmadd231ps_fma(auVar46,auVar63,auVar75);
            auVar67._8_4_ = 0x39506967;
            auVar67._0_8_ = 0x3950696739506967;
            auVar67._12_4_ = 0x39506967;
            auVar67._16_4_ = 0x39506967;
            auVar67._20_4_ = 0x39506967;
            auVar67._24_4_ = 0x39506967;
            auVar67._28_4_ = 0x39506967;
            auVar46 = ZEXT1632(auVar13);
            fVar8 = auVar13._0_4_;
            fVar9 = auVar13._4_4_;
            fVar10 = auVar13._8_4_;
            fVar11 = auVar13._12_4_;
            auVar53._8_4_ = 0x3ab743ce;
            auVar53._0_8_ = 0x3ab743ce3ab743ce;
            auVar53._12_4_ = 0x3ab743ce;
            auVar53._16_4_ = 0x3ab743ce;
            auVar53._20_4_ = 0x3ab743ce;
            auVar53._24_4_ = 0x3ab743ce;
            auVar53._28_4_ = 0x3ab743ce;
            auVar14 = vfmadd213ps_fma(auVar67,auVar46,auVar53);
            auVar54._8_4_ = 0x3c088908;
            auVar54._0_8_ = 0x3c0889083c088908;
            auVar54._12_4_ = 0x3c088908;
            auVar54._16_4_ = 0x3c088908;
            auVar54._20_4_ = 0x3c088908;
            auVar54._24_4_ = 0x3c088908;
            auVar54._28_4_ = 0x3c088908;
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar46,auVar54);
            auVar55._8_4_ = 0x3d2aa9c1;
            auVar55._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar55._12_4_ = 0x3d2aa9c1;
            auVar55._16_4_ = 0x3d2aa9c1;
            auVar55._20_4_ = 0x3d2aa9c1;
            auVar55._24_4_ = 0x3d2aa9c1;
            auVar55._28_4_ = 0x3d2aa9c1;
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar46,auVar55);
            auVar56._8_4_ = 0x3e2aaaaa;
            auVar56._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar56._12_4_ = 0x3e2aaaaa;
            auVar56._16_4_ = 0x3e2aaaaa;
            auVar56._20_4_ = 0x3e2aaaaa;
            auVar56._24_4_ = 0x3e2aaaaa;
            auVar56._28_4_ = 0x3e2aaaaa;
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar56);
            auVar14 = vfmsub213ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar76);
            auVar59._0_4_ = fVar8 + 1.0;
            auVar59._4_4_ = fVar9 + 1.0;
            auVar59._8_4_ = fVar10 + 1.0;
            auVar59._12_4_ = fVar11 + 1.0;
            auVar59._16_4_ = 0x3f800000;
            auVar59._20_4_ = 0x3f800000;
            auVar59._24_4_ = 0x3f800000;
            auVar59._28_4_ = 0x3f800000;
            auVar14 = vfmadd231ps_fma(auVar59,ZEXT1632(CONCAT412(fVar11 * fVar11,
                                                                 CONCAT48(fVar10 * fVar10,
                                                                          CONCAT44(fVar9 * fVar9,
                                                                                   fVar8 * fVar8))))
                                      ,ZEXT1632(auVar14));
            auVar65._0_4_ = (int)auVar63._0_4_;
            auVar65._4_4_ = (int)auVar63._4_4_;
            auVar65._8_4_ = (int)auVar63._8_4_;
            auVar65._12_4_ = (int)auVar63._12_4_;
            auVar65._16_4_ = (int)auVar63._16_4_;
            auVar65._20_4_ = (int)auVar63._20_4_;
            auVar65._24_4_ = (int)auVar63._24_4_;
            auVar65._28_4_ = (int)auVar63._28_4_;
            auVar63 = vpslld_avx2(auVar65,0x17);
            auVar68._8_4_ = 0x3f800000;
            auVar68._0_8_ = 0x3f8000003f800000;
            auVar68._12_4_ = 0x3f800000;
            auVar68._16_4_ = 0x3f800000;
            auVar68._20_4_ = 0x3f800000;
            auVar68._24_4_ = 0x3f800000;
            auVar68._28_4_ = 0x3f800000;
            auVar63 = vpaddd_avx2(auVar63,auVar68);
            auVar60._0_4_ = auVar63._0_4_ * *(float *)*pauVar35 * auVar14._0_4_;
            auVar60._4_4_ = auVar63._4_4_ * *(float *)((long)*pauVar35 + 4) * auVar14._4_4_;
            auVar60._8_4_ = auVar63._8_4_ * *(float *)((long)*pauVar35 + 8) * auVar14._8_4_;
            auVar60._12_4_ = auVar63._12_4_ * *(float *)((long)*pauVar35 + 0xc) * auVar14._12_4_;
            auVar60._16_4_ = auVar63._16_4_ * *(float *)((long)*pauVar35 + 0x10) * 0.0;
            auVar60._20_4_ = auVar63._20_4_ * *(float *)((long)*pauVar35 + 0x14) * 0.0;
            auVar60._24_4_ = auVar63._24_4_ * *(float *)((long)*pauVar35 + 0x18) * 0.0;
            auVar60._28_4_ = 0;
            *pauVar35 = auVar60;
            pauVar44 = pauVar44 + 1;
            pauVar35 = pauVar35 + 1;
            iVar24 = iVar24 + 8;
            uVar23 = uVar40;
          } while (iVar24 < (int)uVar32);
        }
        if (uVar32 - uVar23 != 0 && (int)uVar23 <= (int)uVar32) {
          lVar39 = 0;
          do {
            auVar14 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar44 + lVar39 * 4)),
                                      ZEXT416((uint)fVar71),
                                      ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var3[-3])));
            fVar45 = powf(auVar14._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var3[-3]));
            *(float *)((long)*pauVar35 + lVar39 * 4) =
                 fVar45 * *(float *)((long)*pauVar35 + lVar39 * 4);
            lVar39 = lVar39 + 1;
          } while (uVar32 - uVar23 != (int)lVar39);
        }
        uVar26 = uVar26 + 1;
        uVar40 = (uint)local_240;
      } while (uVar26 != uVar42);
    }
    piVar15 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
    iVar24 = -100;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar22) goto LAB_001f763c;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx2[-3]) == 1) {
    piVar15 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = (int)square_blob.refcount;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = (undefined4)(square_blob.elemsize >> 0x20);
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    uVar32 = uVar40;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3])) {
      uVar32 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar37 = ~uVar32 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
      copy_make_border(&square_blob,&square_sum,uVar32,iVar37,uVar32,iVar37,0,0.0,
                       (Option *)&_space_ofs);
      uVar32 = square_sum.w;
      if (square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0) {
        piVar15 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (square_sum.allocator == (Allocator *)0x0) {
              if (square_sum.data != (void *)0x0) {
                free(square_sum.data);
              }
            }
            else {
              (*(square_sum.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        square_sum.cstep = 0;
        square_sum.data = (void *)0x0;
        square_sum.refcount._0_4_ = 0;
        square_sum.refcount._4_4_ = 0;
        square_sum.elemsize._0_4_ = 0;
        square_sum.elemsize._4_4_ = 0;
        square_sum.elempack = 0;
        square_sum.dims = 0;
        square_sum.w = 0;
        square_sum.h = 0;
        square_sum.d = 0;
        square_sum.c = 0;
        goto LAB_001f763c;
      }
    }
    iVar24 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
    uVar33 = iVar24 * iVar24;
    fVar71 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx2[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar33,&local_241);
    piVar21 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar20 = square_sum.data;
    pp_Var3 = this->_vptr_LRN_x86_avx2;
    iVar37 = *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]);
    if (0 < iVar37) {
      iVar25 = 0;
      iVar29 = 0;
      iVar34 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
          lVar39 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar34 + lVar39] = iVar29 + (int)lVar39;
            lVar39 = lVar39 + 1;
            iVar38 = (int)lVar39;
          } while (iVar38 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
          iVar34 = iVar34 + iVar38;
          iVar29 = iVar29 + iVar38;
        }
        iVar29 = iVar29 + (uVar32 - iVar37);
        iVar25 = iVar25 + 1;
      } while (iVar25 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
    }
    if (0 < (int)_c) {
      pvVar4 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      lVar31 = (long)square_sum.w;
      lVar39 = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      lVar36 = square_sum.cstep * lVar39;
      sVar5 = bottom_top_blob->elemsize;
      local_240 = 0;
      do {
        if (0 < (int)uVar23) {
          lVar27 = lVar36 * local_240;
          pvVar41 = (void *)(sVar2 * sVar5 * local_240 + (long)pvVar4);
          pp_Var3 = this->_vptr_LRN_x86_avx2;
          uVar26 = 0;
          do {
            if (0 < (int)uVar40) {
              uVar43 = 0;
              do {
                if (iVar24 == 0) {
                  fVar45 = 0.0;
                }
                else {
                  fVar45 = 0.0;
                  uVar28 = 0;
                  do {
                    fVar45 = fVar45 + *(float *)((long)pvVar20 +
                                                (long)piVar21[uVar28] * 4 +
                                                uVar43 * 4 + lVar31 * lVar39 * uVar26 + lVar27);
                    uVar28 = uVar28 + 1;
                  } while (uVar33 + (uVar33 == 0) != uVar28);
                }
                auVar14 = vfmadd213ss_fma(ZEXT416((uint)(fVar45 * fVar71)),
                                          ZEXT416((uint)(1.0 / (float)(int)uVar33)),
                                          ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var3[-3])))
                ;
                fVar45 = powf(auVar14._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var3[-3]));
                *(float *)((long)pvVar41 + uVar43 * 4) =
                     fVar45 * *(float *)((long)pvVar41 + uVar43 * 4);
                uVar43 = uVar43 + 1;
              } while (uVar43 != uVar40);
            }
            pvVar41 = (void *)((long)pvVar41 + (long)(int)uVar40 * 4);
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar23);
        }
        local_240 = local_240 + 1;
      } while (local_240 != uVar42);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar15 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
  }
  iVar24 = 0;
LAB_001f763c:
  piVar15 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (square_blob.allocator == (Allocator *)0x0) {
        if (square_blob.data != (void *)0x0) {
          free(square_blob.data);
        }
      }
      else {
        (*(square_blob.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int LRN_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}